

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::initBasic(Value *this,ValueType type,bool allocated)

{
  Comments local_20;
  byte local_15;
  ValueType local_14;
  bool allocated_local;
  Value *pVStack_10;
  ValueType type_local;
  Value *this_local;
  
  local_15 = allocated;
  local_14 = type;
  pVStack_10 = this;
  setType(this,type);
  setIsAllocated(this,(bool)(local_15 & 1));
  memset(&local_20,0,8);
  Comments::Comments(&local_20);
  Comments::operator=(&this->comments_,&local_20);
  Comments::~Comments(&local_20);
  this->start_ = 0;
  this->limit_ = 0;
  return;
}

Assistant:

void Value::initBasic(ValueType type, bool allocated) {
  setType(type);
  setIsAllocated(allocated);
  comments_ = Comments{};
  start_ = 0;
  limit_ = 0;
}